

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExecutionContext.cpp
# Opt level: O1

void __thiscall
rsg::ExecutionContext::ExecutionContext
          (ExecutionContext *this,Sampler2DMap *samplers2D,SamplerCubeMap *samplersCube)

{
  _Rb_tree_header *p_Var1;
  VariableType *pVVar2;
  int i;
  long lVar3;
  ExecConstValueAccess value;
  ExecMaskStorage initVal;
  Scalar local_118 [64];
  
  p_Var1 = &(this->m_varValues)._M_t._M_impl.super__Rb_tree_header;
  (this->m_varValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  lVar3 = 0;
  (this->m_varValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_varValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_varValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_varValues)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_samplers2D = samplers2D;
  this->m_samplersCube = samplersCube;
  (this->m_execMaskStack).
  super__Vector_base<rsg::ExecMaskStorage,_std::allocator<rsg::ExecMaskStorage>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_execMaskStack).
  super__Vector_base<rsg::ExecMaskStorage,_std::allocator<rsg::ExecMaskStorage>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_execMaskStack).
  super__Vector_base<rsg::ExecMaskStorage,_std::allocator<rsg::ExecMaskStorage>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVVar2 = (VariableType *)0x0;
  memset(local_118,0,0x100);
  do {
    local_118[lVar3].boolVal = true;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x40);
  VariableType::getScalarType(TYPE_BOOL);
  value.m_value = local_118;
  value.m_type = pVVar2;
  pushExecutionMask(this,value);
  return;
}

Assistant:

ExecutionContext::ExecutionContext (const Sampler2DMap& samplers2D, const SamplerCubeMap& samplersCube)
	: m_samplers2D		(samplers2D)
	, m_samplersCube	(samplersCube)
{
	// Initialize execution mask to true
	ExecMaskStorage initVal(true);
	pushExecutionMask(initVal.getValue());
}